

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver2.c
# Opt level: O1

sat_solver2 * sat_solver2_new(void)

{
  sat_solver2 *psVar1;
  int *piVar2;
  int **ppiVar3;
  int *piVar4;
  
  psVar1 = (sat_solver2 *)calloc(0x268,1);
  psVar1->var_inc = 0x20;
  psVar1->cla_inc = 0x800;
  psVar1->random_seed = 91648253.0;
  psVar1->fProofLogging = 1;
  psVar1->fVerbose = 0;
  psVar1->fNotUseRandom = 0;
  psVar1->fSkipSimplify = 1;
  psVar1->nLearntMax = 10000;
  psVar1->nLearntStart = 10000;
  psVar1->nLearntDelta = 1000;
  psVar1->nLearntRatio = 0x32;
  (psVar1->order).cap = 4;
  (psVar1->order).size = 0;
  piVar2 = (int *)malloc(0x10);
  (psVar1->order).ptr = piVar2;
  (psVar1->trail_lim).cap = 4;
  (psVar1->trail_lim).size = 0;
  piVar2 = (int *)malloc(0x10);
  (psVar1->trail_lim).ptr = piVar2;
  (psVar1->tagged).cap = 4;
  (psVar1->tagged).size = 0;
  piVar2 = (int *)malloc(0x10);
  (psVar1->tagged).ptr = piVar2;
  (psVar1->stack).cap = 4;
  (psVar1->stack).size = 0;
  piVar2 = (int *)malloc(0x10);
  (psVar1->stack).ptr = piVar2;
  (psVar1->temp_clause).cap = 4;
  (psVar1->temp_clause).size = 0;
  piVar2 = (int *)malloc(0x10);
  (psVar1->temp_clause).ptr = piVar2;
  (psVar1->temp_proof).cap = 4;
  (psVar1->temp_proof).size = 0;
  piVar2 = (int *)malloc(0x10);
  (psVar1->temp_proof).ptr = piVar2;
  (psVar1->conf_final).cap = 4;
  (psVar1->conf_final).size = 0;
  piVar2 = (int *)malloc(0x10);
  (psVar1->conf_final).ptr = piVar2;
  (psVar1->mark_levels).cap = 4;
  (psVar1->mark_levels).size = 0;
  piVar2 = (int *)malloc(0x10);
  (psVar1->mark_levels).ptr = piVar2;
  (psVar1->min_lit_order).cap = 4;
  (psVar1->min_lit_order).size = 0;
  piVar2 = (int *)malloc(0x10);
  (psVar1->min_lit_order).ptr = piVar2;
  (psVar1->min_step_order).cap = 4;
  (psVar1->min_step_order).size = 0;
  piVar2 = (int *)malloc(0x10);
  (psVar1->min_step_order).ptr = piVar2;
  (psVar1->Mem).nEntries[0] = 0;
  (psVar1->Mem).nEntries[1] = 0;
  (psVar1->Mem).BookMarkH[0] = 0;
  (psVar1->Mem).BookMarkH[1] = 0;
  (psVar1->Mem).BookMarkE[0] = 0;
  (psVar1->Mem).BookMarkE[1] = 0;
  (psVar1->Mem).iPage[0] = 0;
  (psVar1->Mem).iPage[1] = 0;
  (psVar1->Mem).pPages = (int **)0x0;
  (psVar1->Mem).nPageSize = 0xe;
  (psVar1->Mem).uPageMask = 0x3fff;
  (psVar1->Mem).uLearnedMask = 0x4000;
  (psVar1->Mem).nPagesAlloc = 0x100;
  ppiVar3 = (int **)calloc(0x100,8);
  (psVar1->Mem).pPages = ppiVar3;
  piVar2 = (int *)malloc(0x10000);
  *ppiVar3 = piVar2;
  piVar4 = (int *)malloc(0x10000);
  ppiVar3[1] = piVar4;
  (psVar1->Mem).iPage[0] = 0;
  (psVar1->Mem).iPage[1] = 1;
  *piVar2 = 2;
  *piVar4 = 2;
  (psVar1->act_clas).cap = 4;
  (psVar1->act_clas).size = 0;
  piVar2 = (int *)malloc(0x10);
  (psVar1->act_clas).ptr = piVar2;
  (psVar1->claProofs).cap = 4;
  (psVar1->claProofs).size = 0;
  piVar2 = (int *)malloc(0x10);
  (psVar1->claProofs).ptr = piVar2;
  psVar1->tempInter = -1;
  psVar1->hLearntLast = -1;
  psVar1->hProofLast = -1;
  psVar1->iVarPivot = 0;
  psVar1->iTrailPivot = 0;
  psVar1->hProofPivot = 1;
  return psVar1;
}

Assistant:

sat_solver2* sat_solver2_new(void)
{
    sat_solver2* s = (sat_solver2 *)ABC_CALLOC( char, sizeof(sat_solver2) );

#ifdef USE_FLOAT_ACTIVITY2
    s->var_inc        = 1;
    s->cla_inc        = 1;
    s->var_decay      = (float)(1 / 0.95  );
    s->cla_decay      = (float)(1 / 0.999 );
//    s->cla_decay      = 1;
//    s->var_decay      = 1;
#else
    s->var_inc        = (1 <<  5);
    s->cla_inc        = (1 << 11);
#endif
    s->random_seed    = 91648253;

#ifdef SAT_USE_PROOF_LOGGING
    s->fProofLogging  =  1;
#else
    s->fProofLogging  =  0;
#endif
    s->fSkipSimplify  =  1;
    s->fNotUseRandom  =  0;
    s->fVerbose       =  0;

    s->nLearntStart   = LEARNT_MAX_START_DEFAULT;  // starting learned clause limit
    s->nLearntDelta   = LEARNT_MAX_INCRE_DEFAULT;  // delta of learned clause limit
    s->nLearntRatio   = LEARNT_MAX_RATIO_DEFAULT;  // ratio of learned clause limit
    s->nLearntMax     = s->nLearntStart;

    // initialize vectors
    veci_new(&s->order);
    veci_new(&s->trail_lim);
    veci_new(&s->tagged);
    veci_new(&s->stack);
    veci_new(&s->temp_clause);
    veci_new(&s->temp_proof);
    veci_new(&s->conf_final);
    veci_new(&s->mark_levels);
    veci_new(&s->min_lit_order);
    veci_new(&s->min_step_order);
//    veci_new(&s->learnt_live);
    Sat_MemAlloc_( &s->Mem, 14 );
    veci_new(&s->act_clas);  
    // proof-logging
    veci_new(&s->claProofs);
//    s->pPrf1 = Vec_SetAlloc( 20 );
    s->tempInter = -1;

    // initialize clause pointers
    s->hLearntLast            = -1; // the last learnt clause 
    s->hProofLast             = -1; // the last proof ID
    // initialize rollback
    s->iVarPivot              =  0; // the pivot for variables
    s->iTrailPivot            =  0; // the pivot for trail
    s->hProofPivot            =  1; // the pivot for proof records
    return s;
}